

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

long __thiscall
gl4cts::anon_unknown_0::NegativeAPIWorkGroupCount::Run(NegativeAPIWorkGroupCount *this)

{
  bool bVar1;
  GLuint GVar2;
  GLenum GVar3;
  int local_60;
  int local_5c;
  GLint z;
  GLint y;
  GLint x;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *glsl_cs;
  NegativeAPIWorkGroupCount *this_local;
  
  local_20 = 
  "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0;\n}"
  ;
  glsl_cs = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,
             "\nlayout(local_size_x = 1) in;\nlayout(std430) buffer Output {\n  uint g_output[];\n};\nvoid main() {\n  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0;\n}"
             ,&local_41);
  GVar2 = ComputeShaderBase::CreateComputeProgram(&this->super_ComputeShaderBase,&local_40);
  this->m_program = GVar2;
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  bVar1 = ComputeShaderBase::CheckProgram
                    (&this->super_ComputeShaderBase,this->m_program,(bool *)0x0);
  if (bVar1) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
    glu::CallLogWrapper::glBindBufferBase
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,0,this->m_storage_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90d2,100000,(void *)0x0,0x88e8);
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x91be,0,&z);
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x91be,1,&local_5c);
    glu::CallLogWrapper::glGetIntegeri_v
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x91be,2,&local_60);
    glu::CallLogWrapper::glUseProgram
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->m_program);
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,z + 1,1,1);
    GVar3 = glu::CallLogWrapper::glGetError
                      (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                        super_CallLogWrapper);
    if (GVar3 == 0x501) {
      glu::CallLogWrapper::glDispatchCompute
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,local_5c + 1,1);
      GVar3 = glu::CallLogWrapper::glGetError
                        (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                          super_CallLogWrapper);
      if (GVar3 == 0x501) {
        glu::CallLogWrapper::glDispatchCompute
                  (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                    super_CallLogWrapper,1,1,local_60 + 1);
        GVar3 = glu::CallLogWrapper::glGetError
                          (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                            super_CallLogWrapper);
        if (GVar3 == 0x501) {
          this_local = (NegativeAPIWorkGroupCount *)0x0;
        }
        else {
          anon_unknown_0::Output
                    (
                    "INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n<num_groups_y> or <num_groups_z> is greater than the value of\nMAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n"
                    );
          this_local = (NegativeAPIWorkGroupCount *)&DAT_ffffffffffffffff;
        }
      }
      else {
        anon_unknown_0::Output
                  (
                  "INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n<num_groups_y> or <num_groups_z> is greater than the value of\nMAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n"
                  );
        this_local = (NegativeAPIWorkGroupCount *)&DAT_ffffffffffffffff;
      }
    }
    else {
      anon_unknown_0::Output
                (
                "INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n<num_groups_y> or <num_groups_z> is greater than the value of\nMAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n"
                );
      this_local = (NegativeAPIWorkGroupCount *)&DAT_ffffffffffffffff;
    }
  }
  else {
    this_local = (NegativeAPIWorkGroupCount *)&DAT_ffffffffffffffff;
  }
  return (long)this_local;
}

Assistant:

virtual long Run()
	{
		const char* const glsl_cs =
			NL "layout(local_size_x = 1) in;" NL "layout(std430) buffer Output {" NL "  uint g_output[];" NL "};" NL
			   "void main() {" NL
			   "  g_output[gl_GlobalInvocationID.x * gl_GlobalInvocationID.y * gl_GlobalInvocationID.z] = 0;" NL "}";
		m_program = CreateComputeProgram(glsl_cs);
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, 100000, NULL, GL_DYNAMIC_DRAW);

		GLint x, y, z;
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 0, &x);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 1, &y);
		glGetIntegeri_v(GL_MAX_COMPUTE_WORK_GROUP_COUNT, 2, &z);

		glUseProgram(m_program);

		glDispatchCompute(x + 1, 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, y + 1, 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		glDispatchCompute(1, 1, z + 1);
		if (glGetError() != GL_INVALID_VALUE)
		{
			Output("INVALID_VALUE is generated by DispatchCompute if any of <num_groups_x>,\n"
				   "<num_groups_y> or <num_groups_z> is greater than the value of\n"
				   "MAX_COMPUTE_WORK_GROUP_COUNT for the corresponding dimension.\n");
			return ERROR;
		}

		return NO_ERROR;
	}